

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

uint __thiscall Js::ByteCodeWriter::EnterLoop(ByteCodeWriter *this,ByteCodeLabel loopEntrance)

{
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FunctionBody *functionBody;
  OpCode local_26;
  undefined1 local_24 [6];
  OpCode loopBodyOpcode;
  uint local_18;
  ByteCodeLabel local_14;
  uint loopId;
  ByteCodeLabel loopEntrance_local;
  ByteCodeWriter *this_local;
  
  local_14 = loopEntrance;
  _loopId = this;
  if ((this->useBranchIsland & 1U) != 0) {
    EnsureLongBranch(this,StatementBoundary);
  }
  local_18 = FunctionBody::IncrLoopCount(this->m_functionWrite);
  uVar3 = JsUtil::
          ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ::Count(&this->m_loopHeaders->
                   super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
                 );
  if (uVar3 != local_18) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xc9a,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = this->m_loopHeaders;
  uVar3 = Data::GetCurrentOffset(&this->m_byteCodeData);
  LoopHeaderData::LoopHeaderData((LoopHeaderData *)local_24,uVar3,0,0 < this->m_loopNest,false);
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,(LoopHeaderData *)local_24);
  this->m_loopNest = this->m_loopNest + 1;
  FunctionBody::SetHasNestedLoop(this->m_functionWrite,1 < this->m_loopNest);
  local_26 = LoopBodyStart;
  functionBody = GetFunctionWrite(this);
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
  if (bVar2) {
    Unsigned1(this,ProfiledLoopStart,local_18);
    local_26 = ProfiledLoopBodyStart;
  }
  MarkLabel(this,local_14);
  bVar2 = DoJitLoopBodies(this);
  if ((bVar2) || (bVar2 = DoInterruptProbes(this), bVar2)) {
    Unsigned1(this,local_26,local_18);
  }
  return local_18;
}

Assistant:

uint ByteCodeWriter::EnterLoop(Js::ByteCodeLabel loopEntrance)
    {
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // If we are going to emit a branch island, it should be before the loop header
            this->EnsureLongBranch(Js::OpCode::StatementBoundary);
        }
#endif

        uint loopId = m_functionWrite->IncrLoopCount();
        Assert((uint)m_loopHeaders->Count() == loopId);

        m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
        m_loopNest++;
        m_functionWrite->SetHasNestedLoop(m_loopNest > 1);

        Js::OpCode loopBodyOpcode = Js::OpCode::LoopBodyStart;
#if ENABLE_PROFILE_INFO
        if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionWrite()))
        {
            this->Unsigned1(Js::OpCode::ProfiledLoopStart, loopId);
            loopBodyOpcode = Js::OpCode::ProfiledLoopBodyStart;
        }
#endif

        this->MarkLabel(loopEntrance);
        if (this->DoJitLoopBodies() || this->DoInterruptProbes())
        {
            this->Unsigned1(loopBodyOpcode, loopId);
        }

        return loopId;
    }